

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildFieldOrExtension
          (DescriptorBuilder *this,FieldDescriptorProto *proto,Descriptor *parent,
          FieldDescriptor *result,bool is_extension)

{
  pointer pcVar1;
  Tables *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  double dVar3;
  Symbol symbol;
  char cVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  Descriptor *pDVar8;
  string *psVar9;
  string *psVar10;
  size_t sVar11;
  long lVar12;
  long *plVar14;
  OptionsType *orig_options;
  size_type *psVar15;
  size_type sVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong uVar18;
  float fVar19;
  SubstituteArg *in_stack_fffffffffffffd78;
  string result_1;
  string local_238;
  Tables *local_218;
  string lowercase_name;
  char *end_pos;
  int local_1e8;
  undefined1 local_1c0 [48];
  undefined4 local_190;
  undefined4 uStack_18c;
  FieldDescriptor *pFStack_188;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  ulong uVar13;
  
  pDVar8 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar8 = (Descriptor *)this->file_;
  }
  psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar8 + 8));
  if (psVar9->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)psVar9,psVar9->_M_string_length,0,'\x01');
  }
  std::__cxx11::string::_M_append((char *)psVar9,(ulong)(((proto->name_).ptr_)->_M_dataplus)._M_p);
  ValidateSymbolName(this,(proto->name_).ptr_,psVar9,&proto->super_Message);
  psVar10 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar10;
  *(string **)(result + 8) = psVar9;
  *(FileDescriptor **)(result + 0x30) = this->file_;
  *(int32 *)(result + 0x38) = proto->number_;
  result[0x50] = (FieldDescriptor)is_extension;
  psVar9 = (proto->name_).ptr_;
  lowercase_name._M_dataplus._M_p = (pointer)&lowercase_name.field_2;
  pcVar1 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&lowercase_name,pcVar1,pcVar1 + psVar9->_M_string_length);
  if (lowercase_name._M_string_length == 0) {
    psVar9 = (proto->name_).ptr_;
    if (psVar9->_M_string_length != 0) goto LAB_002e42c2;
LAB_002e42ac:
    *(undefined8 *)(result + 0x10) = *(undefined8 *)result;
  }
  else {
    sVar16 = 0;
    do {
      if ((byte)(lowercase_name._M_dataplus._M_p[sVar16] + 0xbfU) < 0x1a) {
        lowercase_name._M_dataplus._M_p[sVar16] = lowercase_name._M_dataplus._M_p[sVar16] | 0x20;
      }
      sVar16 = sVar16 + 1;
    } while (lowercase_name._M_string_length != sVar16);
    psVar9 = (proto->name_).ptr_;
    if ((lowercase_name._M_string_length == psVar9->_M_string_length) &&
       ((lowercase_name._M_string_length == 0 ||
        (iVar5 = bcmp(lowercase_name._M_dataplus._M_p,(psVar9->_M_dataplus)._M_p,
                      lowercase_name._M_string_length), iVar5 == 0)))) goto LAB_002e42ac;
LAB_002e42c2:
    psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,&lowercase_name);
    *(string **)(result + 0x10) = psVar9;
    psVar9 = (proto->name_).ptr_;
  }
  pTVar2 = this->tables_;
  anon_unknown_1::ToCamelCase(&result_1,psVar9,true);
  psVar9 = DescriptorPool::Tables::AllocateString(pTVar2,&result_1);
  *(string **)(result + 0x18) = psVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result_1._M_dataplus._M_p != &result_1.field_2) {
    operator_delete(result_1._M_dataplus._M_p,result_1.field_2._M_allocated_capacity + 1);
  }
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    result[0x20] = (FieldDescriptor)0x0;
    local_218 = this->tables_;
    psVar9 = (proto->name_).ptr_;
    result_1._M_string_length = 0;
    result_1.field_2._M_allocated_capacity =
         result_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
    result_1._M_dataplus._M_p = (pointer)&result_1.field_2;
    std::__cxx11::string::reserve((ulong)&result_1);
    uVar13 = psVar9->_M_string_length;
    if (uVar13 != 0) {
      uVar18 = 0;
      do {
        if ((psVar9->_M_dataplus)._M_p[uVar18] != '_') {
          std::__cxx11::string::push_back((char)&result_1);
          uVar13 = psVar9->_M_string_length;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar13);
    }
    psVar9 = DescriptorPool::Tables::AllocateString(local_218,&result_1);
    *(string **)(result + 0x28) = psVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result_1._M_dataplus._M_p != &result_1.field_2) {
      operator_delete(result_1._M_dataplus._M_p,result_1.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    result[0x20] = (FieldDescriptor)0x1;
    psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->json_name_).ptr_);
    *(string **)(result + 0x28) = psVar9;
  }
  paVar17 = &result_1.field_2;
  *(int *)(result + 0x48) = proto->type_;
  iVar5 = proto->label_;
  *(int *)(result + 0x4c) = iVar5;
  if ((iVar5 == 2 & (byte)result[0x50]) == 1) {
    AddError(this,*(string **)(result + 8),&proto->super_Message,TYPE,
             "Message extensions cannot have required fields.");
  }
  *(undefined8 *)(result + 0x58) = 0;
  *(undefined8 *)(result + 0x40) = 0;
  *(undefined8 *)(result + 0xa0) = 0;
  *(undefined8 *)(result + 0x68) = 0;
  *(undefined8 *)(result + 0x70) = 0;
  *(undefined8 *)(result + 0x78) = 0;
  *(undefined8 *)(result + 0x88) = 0;
  *(undefined8 *)(result + 0x90) = 0;
  uVar6 = (proto->_has_bits_).has_bits_[0];
  result[0x98] = SUB41((uVar6 & 8) >> 3,0);
  if (((uVar6 & 8) != 0) && (*(int *)(result + 0x4c) == 3)) {
    AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
             "Repeated fields can\'t have default values.");
    uVar6 = (proto->_has_bits_).has_bits_[0];
  }
  if ((uVar6 >> 9 & 1) == 0) goto switchD_002e4670_default;
  if ((uVar6 & 8) == 0) {
    if (*(GoogleOnceDynamic **)(result + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(result + 0x40),FieldDescriptor::TypeOnceInit,result);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(result + 0x48) * 4)
          ) {
    case 1:
    case 3:
    case 6:
      *(undefined4 *)(result + 0xa0) = 0;
      break;
    case 2:
    case 4:
    case 5:
    case 8:
      *(undefined8 *)(result + 0xa0) = 0;
      break;
    case 7:
      result[0xa0] = (FieldDescriptor)0x0;
      break;
    case 9:
      if (internal::empty_string_once_init_ != 2) {
        result_1._M_dataplus._M_p = (pointer)&PTR__FunctionClosure0_00425198;
        result_1._M_string_length = (size_type)internal::InitEmptyString;
        result_1.field_2._M_allocated_capacity =
             result_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
        GoogleOnceInitImpl(&internal::empty_string_once_init_,(Closure *)&result_1);
        internal::FunctionClosure0::~FunctionClosure0((FunctionClosure0 *)&result_1);
      }
      *(undefined8 **)(result + 0xa0) = &internal::fixed_address_empty_string_abi_cxx11_;
    }
    goto switchD_002e4670_default;
  }
  end_pos = (char *)0x0;
  if (*(GoogleOnceDynamic **)(result + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(result + 0x40),FieldDescriptor::TypeOnceInit,result);
  }
  uVar6 = *(uint *)(result + 0x48);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar6 * 4)) {
  case 1:
    lVar12 = strtol((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    uVar7 = (undefined4)lVar12;
    goto LAB_002e4bd4;
  case 2:
    psVar9 = (string *)strtoll((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_002e4dae;
  case 3:
    uVar13 = strtoul((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    uVar7 = (undefined4)uVar13;
LAB_002e4bd4:
    *(undefined4 *)(result + 0xa0) = uVar7;
    break;
  case 4:
    psVar9 = (string *)strtoull((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos,0);
    goto LAB_002e4dae;
  case 5:
    iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
    if (iVar5 == 0) {
      psVar9 = (string *)0x7ff0000000000000;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
      if (iVar5 == 0) {
        psVar9 = (string *)0xfff0000000000000;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
        if (iVar5 != 0) {
          dVar3 = io::NoLocaleStrtod((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos);
          *(double *)(result + 0xa0) = dVar3;
          break;
        }
        psVar9 = (string *)0x7ff8000000000000;
      }
    }
LAB_002e4dae:
    *(string **)(result + 0xa0) = psVar9;
    break;
  case 6:
    iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
    if (iVar5 == 0) {
      *(undefined4 *)(result + 0xa0) = 0x7f800000;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
      if (iVar5 == 0) {
        *(undefined4 *)(result + 0xa0) = 0xff800000;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
        if (iVar5 == 0) {
          *(undefined4 *)(result + 0xa0) = 0x7fc00000;
        }
        else {
          dVar3 = io::NoLocaleStrtod((((proto->default_value_).ptr_)->_M_dataplus)._M_p,&end_pos);
          fVar19 = io::SafeDoubleToFloat(dVar3);
          *(float *)(result + 0xa0) = fVar19;
        }
      }
    }
    break;
  case 7:
    iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
    if (iVar5 == 0) {
      result[0xa0] = (FieldDescriptor)0x1;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)(proto->default_value_).ptr_);
      if (iVar5 == 0) {
        result[0xa0] = (FieldDescriptor)0x0;
      }
      else {
        AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
                 "Boolean default must be true or false.");
      }
    }
    break;
  case 8:
    *(undefined8 *)(result + 0xa0) = 0;
    break;
  case 9:
    if (*(GoogleOnceDynamic **)(result + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(result + 0x40),FieldDescriptor::TypeOnceInit,result);
      uVar6 = *(uint *)(result + 0x48);
    }
    pTVar2 = this->tables_;
    if (uVar6 != 0xc) {
      psVar9 = DescriptorPool::Tables::AllocateString(pTVar2,(proto->default_value_).ptr_);
      goto LAB_002e4dae;
    }
    UnescapeCEscapeString(&result_1,(proto->default_value_).ptr_);
    psVar9 = DescriptorPool::Tables::AllocateString(pTVar2,&result_1);
    *(string **)(result + 0xa0) = psVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result_1._M_dataplus._M_p != paVar17) {
      operator_delete(result_1._M_dataplus._M_p,result_1.field_2._M_allocated_capacity + 1);
    }
    break;
  case 10:
    AddError(this,*(string **)(result + 8),&proto->super_Message,DEFAULT_VALUE,
             "Messages can\'t have default values.");
    result[0x98] = (FieldDescriptor)0x0;
  }
  if ((end_pos != (char *)0x0) &&
     ((__rhs = (proto->default_value_).ptr_, __rhs->_M_string_length == 0 || (*end_pos != '\0')))) {
    psVar9 = *(string **)(result + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                   "Couldn\'t parse default value \"",__rhs);
    plVar14 = (long *)std::__cxx11::string::append(local_1c0);
    psVar15 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar15) {
      result_1.field_2._M_allocated_capacity = *psVar15;
      result_1.field_2._8_8_ = plVar14[3];
      result_1._M_dataplus._M_p = (pointer)paVar17;
    }
    else {
      result_1.field_2._M_allocated_capacity = *psVar15;
      result_1._M_dataplus._M_p = (pointer)*plVar14;
    }
    result_1._M_string_length = plVar14[1];
    *plVar14 = (long)psVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    AddError(this,psVar9,&proto->super_Message,DEFAULT_VALUE,&result_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result_1._M_dataplus._M_p != paVar17) {
      operator_delete(result_1._M_dataplus._M_p,result_1.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
  }
switchD_002e4670_default:
  uVar6 = *(uint *)(result + 0x38);
  if ((int)uVar6 < 1) {
    AddError(this,*(string **)(result + 8),&proto->super_Message,NUMBER,
             "Field numbers must be positive integers.");
LAB_002e469f:
    uVar6 = (proto->_has_bits_).has_bits_[0];
    cVar4 = (char)uVar6;
    if (!is_extension) goto LAB_002e4820;
    if ((uVar6 & 2) == 0) {
      AddError(this,*(string **)(result + 8),&proto->super_Message,EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
      cVar4 = (char)(proto->_has_bits_).has_bits_[0];
    }
    *(Descriptor **)(result + 0x68) = parent;
    if (cVar4 < '\0') {
      AddError(this,*(string **)(result + 8),&proto->super_Message,OTHER,
               "FieldDescriptorProto.oneof_index should not be set for extensions.");
    }
  }
  else {
    if (uVar6 < 0x20000000 || is_extension) {
      if (uVar6 - 19000 < 1000) {
        pTVar2 = *(Tables **)(result + 8);
        result_1._M_dataplus._M_p =
             FastInt32ToBuffer(19000,(char *)((long)&result_1._M_string_length + 4));
        local_218 = pTVar2;
        sVar11 = strlen(result_1._M_dataplus._M_p);
        result_1._M_string_length = CONCAT44(result_1._M_string_length._4_4_,(int)sVar11);
        local_1c0._0_8_ = FastInt32ToBuffer(19999,local_1c0 + 0xc);
        sVar11 = strlen((char *)local_1c0._0_8_);
        local_1c0._8_4_ = (undefined4)sVar11;
        end_pos = (char *)0x0;
        local_1e8 = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_238,
                   (strings *)
                   "Field numbers $0 through $1 are reserved for the protocol buffer library implementation."
                   ,(char *)&result_1,(SubstituteArg *)local_1c0,(SubstituteArg *)&end_pos,&local_60
                   ,&local_90,&local_c0,&local_f0,&local_120,&local_150,&local_180,
                   in_stack_fffffffffffffd78);
        AddError(this,(string *)local_218,&proto->super_Message,NUMBER,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_002e469f;
    }
    psVar9 = *(string **)(result + 8);
    result_1._M_dataplus._M_p =
         FastInt32ToBuffer(0x1fffffff,(char *)((long)&result_1._M_string_length + 4));
    sVar11 = strlen(result_1._M_dataplus._M_p);
    result_1._M_string_length = CONCAT44(result_1._M_string_length._4_4_,(int)sVar11);
    local_1c0._0_8_ = (char *)0x0;
    local_1c0._8_4_ = -1;
    end_pos = (char *)0x0;
    local_1e8 = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_238,(strings *)"Field numbers cannot be greater than $0.",(char *)&result_1,
               (SubstituteArg *)local_1c0,(SubstituteArg *)&end_pos,&local_60,&local_90,&local_c0,
               &local_f0,&local_120,&local_150,&local_180,in_stack_fffffffffffffd78);
    AddError(this,psVar9,&proto->super_Message,NUMBER,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    uVar6 = (proto->_has_bits_).has_bits_[0];
LAB_002e4820:
    cVar4 = (char)uVar6;
    if ((uVar6 & 2) != 0) {
      AddError(this,*(string **)(result + 8),&proto->super_Message,EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
      cVar4 = (char)(proto->_has_bits_).has_bits_[0];
    }
    *(Descriptor **)(result + 0x58) = parent;
    if (cVar4 < '\0') {
      iVar5 = proto->oneof_index_;
      if ((-1 < (long)iVar5) && (iVar5 < *(int *)(parent + 0x38))) {
        lVar12 = (long)iVar5 * 0x30 + *(long *)(parent + 0x40);
        goto LAB_002e4a00;
      }
      psVar9 = *(string **)(result + 8);
      result_1._M_dataplus._M_p =
           FastInt32ToBuffer(iVar5,(char *)((long)&result_1._M_string_length + 4));
      sVar11 = strlen(result_1._M_dataplus._M_p);
      result_1._M_string_length = CONCAT44(result_1._M_string_length._4_4_,(int)sVar11);
      local_1c0._0_8_ = **(undefined8 **)parent;
      local_1c0._8_4_ = *(undefined4 *)(*(undefined8 **)parent + 1);
      end_pos = (char *)0x0;
      local_1e8 = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_238,
                 (strings *)"FieldDescriptorProto.oneof_index $0 is out of range for type \"$1\".",
                 (char *)&result_1,(SubstituteArg *)local_1c0,(SubstituteArg *)&end_pos,&local_60,
                 &local_90,&local_c0,&local_f0,&local_120,&local_150,&local_180,
                 in_stack_fffffffffffffd78);
      AddError(this,psVar9,&proto->super_Message,OTHER,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
    }
  }
  lVar12 = 0;
LAB_002e4a00:
  *(long *)(result + 0x60) = lVar12;
  if (((proto->_has_bits_).has_bits_[0] & 0x20) == 0) {
    *(undefined8 *)(result + 0x80) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = (OptionsType *)&_FieldOptions_default_instance_;
    }
    AllocateOptionsImpl<google::protobuf::FieldDescriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  local_190 = 2;
  symbol._4_4_ = uStack_18c;
  symbol.type = 2;
  symbol.field_1.field_descriptor = result;
  pFStack_188 = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lowercase_name._M_dataplus._M_p != &lowercase_name.field_2) {
    operator_delete(lowercase_name._M_dataplus._M_p,lowercase_name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildFieldOrExtension(const FieldDescriptorProto& proto,
                                              const Descriptor* parent,
                                              FieldDescriptor* result,
                                              bool is_extension) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_         = tables_->AllocateString(proto.name());
  result->full_name_    = full_name;
  result->file_         = file_;
  result->number_       = proto.number();
  result->is_extension_ = is_extension;

  // If .proto files follow the style guide then the name should already be
  // lower-cased.  If that's the case we can just reuse the string we already
  // allocated rather than allocate a new one.
  string lowercase_name(proto.name());
  LowerString(&lowercase_name);
  if (lowercase_name == proto.name()) {
    result->lowercase_name_ = result->name_;
  } else {
    result->lowercase_name_ = tables_->AllocateString(lowercase_name);
  }

  // Don't bother with the above optimization for camel-case names since
  // .proto files that follow the guide shouldn't be using names in this
  // format, so the optimization wouldn't help much.
  result->camelcase_name_ =
      tables_->AllocateString(ToCamelCase(proto.name(),
                                          /* lower_first = */ true));

  if (proto.has_json_name()) {
    result->has_json_name_ = true;
    result->json_name_ = tables_->AllocateString(proto.json_name());
  } else {
    result->has_json_name_ = false;
    result->json_name_ = tables_->AllocateString(ToJsonName(proto.name()));
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  result->type_  = static_cast<FieldDescriptor::Type>(
                     implicit_cast<int>(proto.type()));
  result->label_ = static_cast<FieldDescriptor::Label>(
                     implicit_cast<int>(proto.label()));

  // An extension cannot have a required field (b/13365836).
  if (result->is_extension_ &&
      result->label_ == FieldDescriptor::LABEL_REQUIRED) {
    AddError(result->full_name(), proto,
             // Error location `TYPE`: we would really like to indicate
             // `LABEL`, but the `ErrorLocation` enum has no entry for this, and
             // we don't necessarily know about all implementations of the
             // `ErrorCollector` interface to extend them to handle the new
             // error location type properly.
             DescriptorPool::ErrorCollector::TYPE,
             "Message extensions cannot have required fields.");
  }

  // Some of these may be filled in when cross-linking.
  result->containing_type_ = NULL;
  result->extension_scope_ = NULL;
  result->message_type_ = NULL;
  result->enum_type_ = NULL;
  result->type_name_ = NULL;
  result->type_once_ = NULL;
  result->default_value_enum_ = NULL;
  result->default_value_enum_name_ = NULL;

  result->has_default_value_ = proto.has_default_value();
  if (proto.has_default_value() && result->is_repeated()) {
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Repeated fields can't have default values.");
  }

  if (proto.has_type()) {
    if (proto.has_default_value()) {
      char* end_pos = NULL;
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ =
            strtol(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ =
            strto64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ =
            strtoul(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ =
            strtou64(proto.default_value().c_str(), &end_pos, 0);
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          if (proto.default_value() == "inf") {
            result->default_value_float_ =
                std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_float_ =
                -std::numeric_limits<float>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_float_ =
                std::numeric_limits<float>::quiet_NaN();
          } else  {
            result->default_value_float_ = io::SafeDoubleToFloat(
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos));
          }
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          if (proto.default_value() == "inf") {
            result->default_value_double_ =
                std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "-inf") {
            result->default_value_double_ =
                -std::numeric_limits<double>::infinity();
          } else if (proto.default_value() == "nan") {
            result->default_value_double_ =
                std::numeric_limits<double>::quiet_NaN();
          } else  {
            result->default_value_double_ =
                io::NoLocaleStrtod(proto.default_value().c_str(), &end_pos);
          }
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          if (proto.default_value() == "true") {
            result->default_value_bool_ = true;
          } else if (proto.default_value() == "false") {
            result->default_value_bool_ = false;
          } else {
            AddError(result->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Boolean default must be true or false.");
          }
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          if (result->type() == FieldDescriptor::TYPE_BYTES) {
            result->default_value_string_ = tables_->AllocateString(
              UnescapeCEscapeString(proto.default_value()));
          } else {
            result->default_value_string_ =
                tables_->AllocateString(proto.default_value());
          }
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Messages can't have default values.");
          result->has_default_value_ = false;
          break;
      }

      if (end_pos != NULL) {
        // end_pos is only set non-NULL by the parsers for numeric types, above.
        // This checks that the default was non-empty and had no extra junk
        // after the end of the number.
        if (proto.default_value().empty() || *end_pos != '\0') {
          AddError(result->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Couldn't parse default value \"" + proto.default_value() +
                   "\".");
        }
      }
    } else {
      // No explicit default value
      switch (result->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
          result->default_value_int32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_INT64:
          result->default_value_int64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT32:
          result->default_value_uint32_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_UINT64:
          result->default_value_uint64_ = 0;
          break;
        case FieldDescriptor::CPPTYPE_FLOAT:
          result->default_value_float_ = 0.0f;
          break;
        case FieldDescriptor::CPPTYPE_DOUBLE:
          result->default_value_double_ = 0.0;
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          result->default_value_bool_ = false;
          break;
        case FieldDescriptor::CPPTYPE_ENUM:
          // This will be filled in when cross-linking.
          result->default_value_enum_ = NULL;
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          result->default_value_string_ = &internal::GetEmptyString();
          break;
        case FieldDescriptor::CPPTYPE_MESSAGE:
          break;
      }
    }
  }

  if (result->number() <= 0) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Field numbers must be positive integers.");
  } else if (!is_extension && result->number() > FieldDescriptor::kMaxNumber) {
    // Only validate that the number is within the valid field range if it is
    // not an extension. Since extension numbers are validated with the
    // extendee's valid set of extension numbers, and those are in turn
    // validated against the max allowed number, the check is unnecessary for
    // extension fields.
    // This avoids cross-linking issues that arise when attempting to check if
    // the extendee is a message_set_wire_format message, which has a higher max
    // on extension numbers.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute("Field numbers cannot be greater than $0.",
                                 FieldDescriptor::kMaxNumber));
  } else if (result->number() >= FieldDescriptor::kFirstReservedNumber &&
             result->number() <= FieldDescriptor::kLastReservedNumber) {
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             strings::Substitute(
               "Field numbers $0 through $1 are reserved for the protocol "
               "buffer library implementation.",
               FieldDescriptor::kFirstReservedNumber,
               FieldDescriptor::kLastReservedNumber));
  }

  if (is_extension) {
    if (!proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee not set for extension field.");
    }

    result->extension_scope_ = parent;

    if (proto.has_oneof_index()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "FieldDescriptorProto.oneof_index should not be set for "
               "extensions.");
    }

    // Fill in later (maybe).
    result->containing_oneof_ = NULL;
  } else {
    if (proto.has_extendee()) {
      AddError(result->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "FieldDescriptorProto.extendee set for non-extension field.");
    }

    result->containing_type_ = parent;

    if (proto.has_oneof_index()) {
      if (proto.oneof_index() < 0 ||
          proto.oneof_index() >= parent->oneof_decl_count()) {
        AddError(result->full_name(), proto,
                 DescriptorPool::ErrorCollector::OTHER,
                 strings::Substitute("FieldDescriptorProto.oneof_index $0 is "
                                     "out of range for type \"$1\".",
                                     proto.oneof_index(),
                                     parent->name()));
        result->containing_oneof_ = NULL;
      } else {
        result->containing_oneof_ = parent->oneof_decl(proto.oneof_index());
      }
    } else {
      result->containing_oneof_ = NULL;
    }
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }


  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}